

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::FlatHashMap_IteratesMsan_Test::~FlatHashMap_IteratesMsan_Test
          (FlatHashMap_IteratesMsan_Test *this)

{
  FlatHashMap_IteratesMsan_Test *this_local;
  
  ~FlatHashMap_IteratesMsan_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, IteratesMsan) {
  // Because SwissTable randomizes on pointer addresses, we keep old tables
  // around to ensure we don't reuse old memory.
  std::vector<ThisMap<int, balast>> garbage;
  for (int i = 0; i < 100; ++i) {
    ThisMap<int, balast> t;
    for (int j = 0; j < 100; ++j) {
      t[j];
      for (const auto& p : t) EXPECT_THAT(p, Pair(_, _));
    }
    garbage.push_back(std::move(t));
  }
}